

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::scan
               (ReturnUpdater *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  _func_void_ReturnUpdater_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_006c3fec:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_006c3c89:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_006c3fec;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>).
                     super_Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006c3c72;
  case LoopId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_006c3fec;
    }
    goto LAB_006c385a;
  case BreakId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_006c3fec;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>).
                     super_Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_006c34ad;
  case SwitchId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_006c3fec;
    }
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x006c325c;
  case CallId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_006c3fec;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006c3c89;
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitCallIndirect,currp
              );
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_006c3fec;
    }
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_006c3c89;
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_006c3fec;
    }
    break;
  case LocalSetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3948;
  case GlobalGetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_006c3fec;
    }
    break;
  case GlobalSetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_006c3fec;
    }
    goto LAB_006c385a;
  case LoadId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_006c3fec;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_006c3bc3;
  case StoreId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3911;
  case ConstId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_006c3fec;
    }
    break;
  case UnaryId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3948;
  case BinaryId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3ba3;
  case SelectId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_006c3fec;
    }
    goto LAB_006c357d;
  case DropId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case ReturnId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3253;
  case MemorySizeId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_006c3fec;
    }
    break;
  case MemoryGrowId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case NopId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_006c3fec;
    }
    break;
  case UnreachableId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitUnreachable,currp)
    ;
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_006c3fec;
    }
    break;
  case AtomicRMWId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_006c3fec;
    }
    goto LAB_006c39e7;
  case AtomicCmpxchgId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitAtomicCmpxchg,
               currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_006c3fec;
    }
    goto LAB_006c39cd;
  case AtomicWaitId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_006c3fec;
    }
    goto LAB_006c30ea;
  case AtomicNotifyId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitAtomicNotify,currp
              );
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3ba3;
  case AtomicFenceId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitAtomicFence,currp)
    ;
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_006c3fec;
    }
    break;
  case SIMDExtractId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSIMDExtract,currp)
    ;
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3948;
  case SIMDReplaceId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSIMDReplace,currp)
    ;
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_006c3fec;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_006c3bae;
  case SIMDShuffleId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSIMDShuffle,currp)
    ;
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b21;
  case SIMDTernaryId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSIMDTernary,currp)
    ;
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_006c3fec;
    }
    goto LAB_006c30ea;
  case SIMDShiftId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3ba3;
  case SIMDLoadId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_006c3fec;
    }
    goto LAB_006c378f;
  case SIMDLoadStoreLaneId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitSIMDLoadStoreLane,
               currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_006c3fec;
    }
LAB_006c3911:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_006c3bc3;
  case MemoryInitId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_006c3fec;
    }
LAB_006c39cd:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_006c39e7;
  case DataDropId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_006c3fec;
    }
    break;
  case MemoryCopyId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_006c3fec;
    }
    goto LAB_006c357d;
  case MemoryFillId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_006c3fec;
    }
    goto LAB_006c357d;
  case PopId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_006c3fec;
    }
    break;
  case RefNullId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_006c3fec;
    }
    break;
  case RefIsNullId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case RefFuncId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_006c3fec;
    }
    break;
  case RefEqId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b21;
  case TableGetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_006c3fec;
    }
    goto LAB_006c385a;
  case TableSetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_006c3fec;
    }
    goto LAB_006c39e7;
  case TableSizeId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_006c3fec;
    }
    break;
  case TableGrowId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_006c3fec;
    }
LAB_006c39e7:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_006c3bc3;
  case TryId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_006c3fec;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_006c3c89;
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_006c385a:
    pEVar1 = pEVar1 + 2;
    goto LAB_006c3bc3;
  case ThrowId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_006c3fec;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_006c3c89;
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_006c3fec;
    }
    break;
  case TupleMakeId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_006c3fec;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006c3c89;
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitTupleExtract,currp
              );
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case I31NewId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case I31GetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case CallRefId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_006c3fec;
    }
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006c3c89;
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case RefCastId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case BrOnId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_006c3fec;
    }
LAB_006c378f:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_006c3bc3;
  case StructNewId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_006c3fec;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006c3c89;
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3948;
  case StructSetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3ba3;
  case ArrayNewId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_006c3fec;
    }
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
LAB_006c3253:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x006c325c:
    if (lVar4 != 0) {
LAB_006c34ad:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>).
                     super_Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArrayNewSeg,currp)
    ;
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_006c3fec;
    }
    goto LAB_006c32fb;
  case ArrayNewFixedId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArrayNewFixed,
               currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_006c3fec;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006c3c89;
        Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
                  ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b21;
  case ArraySetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_006c3fec;
    }
    goto LAB_006c357d;
  case ArrayLenId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b7b;
  case ArrayCopyId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_006c3fec;
    }
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_006c308c;
  case ArrayFillId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_006c3fec;
    }
LAB_006c308c:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_006c357d;
  case ArrayInitId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_006c3fec;
    }
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 4));
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
LAB_006c32fb:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_006c3bc3;
  case RefAsId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3948;
  case StringNewId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_006c3fec;
    }
    local_38 = pEVar1 + 3;
    local_40 = scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>).
                     super_Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>).
                     super_Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>).
                     super_Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006c3c72;
  case StringConstId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringConst,currp)
    ;
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_006c3fec;
    }
    break;
  case StringMeasureId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringMeasure,
               currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3948;
  case StringEncodeId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringEncode,currp
              );
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_006c3fec;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,wasm::Visitor<wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>&,wasm::Module*)::ReturnUpdater,void>>::Task,10ul>
                  *)&(self->super_PostWalker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>).
                     super_Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_006c3c72:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringConcat,currp
              );
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b21;
  case StringEqId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3ba3;
  case StringAsId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_006c3fec;
    }
LAB_006c3948:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006c3bc3;
  case StringWTF8AdvanceId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringWTF8Advance,
               currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_006c3fec;
    }
LAB_006c357d:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_006c3b21;
  case StringWTF16GetId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringWTF16Get,
               currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_006c3fec;
    }
    goto LAB_006c3b21;
  case StringIterNextId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringIterNext,
               currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_006c3fec;
    }
LAB_006c3b7b:
    pEVar1 = pEVar1 + 1;
LAB_006c3bc3:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringIterMove,
               currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_006c3fec;
    }
LAB_006c3ba3:
    currp_00 = pEVar1 + 2;
LAB_006c3bae:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006c3bc3;
  case StringSliceWTFId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringSliceWTF,
               currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_006c3fec;
    }
LAB_006c30ea:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_006c3bae;
  case StringSliceIterId:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,
               Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::doVisitStringSliceIter,
               currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_006c3fec;
    }
LAB_006c3b21:
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::pushTask
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006c3bc3;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }